

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O3

void __thiscall
PlantUmlGenerator::generate(PlantUmlGenerator *this,ostream *output,ScName *name,int indentLevel)

{
  _Rb_tree_header *p_Var1;
  ScHistoryMode historyMode;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  ScName *pSVar7;
  long lVar8;
  ostream *poVar9;
  PlantUmlGenerator *this_00;
  PlantUmlGenerator *pPVar10;
  _Base_ptr p_Var11;
  const_iterator cVar12;
  _Rb_tree_node_base *p_Var13;
  bool isTransitionHighlighted;
  PlantUmlGenerator *pPVar14;
  pointer name_00;
  long lVar15;
  string indent;
  ScName targetAlias;
  string local_90;
  mapped_type *local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  ostream *local_58;
  ScName local_50;
  
  local_58 = output;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>_>
           ::at(&((this->super_AbstractGenerator).m_model)->m_states,name);
  p_Var6 = (_Base_ptr)alias(this,name);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  this_00 = (PlantUmlGenerator *)&local_90;
  std::__cxx11::string::_M_construct((ulong)this_00,(char)indentLevel * '\x02');
  poVar4 = local_58;
  local_68 = (_Base_ptr)(ulong)(uint)indentLevel;
  if (0 < indentLevel) {
    this_00 = this;
    beginState(this,local_58,&local_90,name,(ScName *)p_Var6);
  }
  historyMode = (pmVar5->historyState).mode;
  local_60 = p_Var6;
  if (historyMode != None) {
    this_00 = this;
    pSVar7 = alias(this,&(pmVar5->historyState).initial);
    historyPseudoState(this_00,poVar4,&local_90,pSVar7,historyMode);
  }
  lVar8 = (long)(pmVar5->regions).super__Vector_base<ScRegion,_std::allocator<ScRegion>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pmVar5->regions).super__Vector_base<ScRegion,_std::allocator<ScRegion>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_70 = pmVar5;
  if (lVar8 != 0) {
    lVar8 = (lVar8 >> 4) * -0x3333333333333333;
    iVar3 = (int)local_68;
    lVar15 = 0;
    do {
      if (lVar15 != 0) {
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"--\n",3);
      }
      name_00 = (local_70->regions).super__Vector_base<ScRegion,_std::allocator<ScRegion>_>._M_impl.
                super__Vector_impl_data._M_start + lVar15;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[*] --> ",8);
      pSVar7 = alias(this,&name_00->initial);
      this_00 = (PlantUmlGenerator *)
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,(pSVar7->_M_dataplus)._M_p,pSVar7->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
      pPVar10 = *(PlantUmlGenerator **)((long)&(name_00->states)._M_t._M_impl + 0x18);
      while (pPVar14 = pPVar10,
            pPVar14 != (PlantUmlGenerator *)((long)&(name_00->states)._M_t._M_impl + 8U)) {
        generate(this,poVar4,
                 (ScName *)
                 &(pPVar14->super_AbstractGenerator).m_highlightSet._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_parent,iVar3 + 1);
        pPVar10 = (PlantUmlGenerator *)std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar14);
        this_00 = pPVar14;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar8 + (ulong)(lVar8 == 0));
  }
  p_Var6 = local_60;
  pmVar5 = local_70;
  if (0 < (int)local_68) {
    endState(this_00,poVar4,&local_90);
  }
  if ((pmVar5->deferrals)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,*(char **)p_Var6,(long)p_Var6->_M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," : Deferrals:\n",0xe);
    p_Var11 = (pmVar5->deferrals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(pmVar5->deferrals)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
      do {
        deferralLink(this,poVar4,&local_90,(ScName *)p_Var6,(ScName *)(p_Var11 + 1));
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var1);
    }
  }
  p_Var6 = (pmVar5->transitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = (mapped_type *)&(pmVar5->transitions)._M_t._M_impl.super__Rb_tree_header;
  if ((mapped_type *)p_Var6 != local_70) {
    do {
      isTransitionHighlighted = false;
      for (p_Var13 = *(_Rb_tree_node_base **)(p_Var6 + 3);
          p_Var13 != (_Rb_tree_node_base *)&p_Var6[2]._M_left;
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
        if (p_Var13[1]._M_parent != (_Base_ptr)0x0) {
          cVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&(this->super_AbstractGenerator).m_highlightSet._M_t,
                          (key_type *)(p_Var13 + 1));
          isTransitionHighlighted =
               (bool)(isTransitionHighlighted |
                     (_Rb_tree_header *)cVar12._M_node !=
                     &(this->super_AbstractGenerator).m_highlightSet._M_t._M_impl.
                      super__Rb_tree_header);
        }
      }
      pSVar7 = alias(this,(ScName *)(p_Var6 + 1));
      pcVar2 = (pSVar7->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + pSVar7->_M_string_length);
      poVar4 = local_58;
      if ((p_Var6[2]._M_color + ~_S_black < 2) || (p_Var6[2]._M_color != _S_red)) {
        std::__cxx11::string::append((char *)&local_50);
      }
      transitionLink(this,poVar4,&local_90,isTransitionHighlighted,(ScName *)local_60,&local_50,
                     (ScNameSet *)&p_Var6[2]._M_parent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        (ulong)(local_50.field_2._M_allocated_capacity + 1));
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((mapped_type *)p_Var6 != local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PlantUmlGenerator::generate(std::ostream &output, const ScName &name, int indentLevel)
{
    const auto &state = m_model.states().at(name);
    const auto &nameAlias = alias(name);

    std::string indent(indentLevel * 2, ' ');

    // Exclude the outerbox with a state machine name:
    if (indentLevel > 0) {
        beginState(output, indent, name, nameAlias);
    }

    // History pseudo-state:
    if (auto historyMode = state.historyState.mode; historyMode != ScHistoryMode::None) {
        historyPseudoState(output, indent, alias(state.historyState.initial), historyMode);
    }

    // Substates:
    const auto totalRegions = state.regions.size();
    for (ScRegionNum regionNum = 0; regionNum < totalRegions; regionNum++) {
        if (regionNum > 0) {
            output << indent << "--\n";
        }

        const auto &substates = state.regions[regionNum];
        output << indent << "[*] --> " << alias(substates.initial) << "\n";
        for (const auto &substateName : substates.states) {
            generate(output, substateName, indentLevel + 1);
        }
    }

    if (indentLevel > 0) {
        endState(output, indent);
    }

    // Deferrals:
    if (!state.deferrals.empty()) {
        output << indent << nameAlias << " : Deferrals:\n";
        for (const auto &eventName : state.deferrals) {
            deferralLink(output, indent, nameAlias, eventName);
        }
    }

    // Transitions:
    for (const auto &[target, eventNames] : state.transitions) {
        bool isTransitionHighlighted = false;
        for (const auto &eventName : eventNames) {
            if (!eventName.empty() && isHighlighted(eventName)) {
                isTransitionHighlighted = true;
            }
        }

        auto targetAlias = alias(target.name);

        // History states in PlantUML can be references as StateName[H] or StateName[H*]:
        if (target.historyMode != ScHistoryMode::None) {
            targetAlias.append(puHistoryState(target.historyMode));
        }

        transitionLink(output, indent, isTransitionHighlighted, nameAlias, targetAlias, eventNames);
    }
}